

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLUtil.cpp
# Opt level: O2

ByteString * OSSL::pt2ByteString(ByteString *__return_storage_ptr__,EC_POINT *pt,EC_GROUP *grp)

{
  size_t newSize;
  uchar *buf;
  ByteString raw;
  
  ByteString::ByteString(&raw);
  if (pt == (EC_POINT *)0x0 || grp == (EC_GROUP *)0x0) {
    ByteString::ByteString(__return_storage_ptr__,&raw);
  }
  else {
    newSize = EC_POINT_point2oct((EC_GROUP *)grp,(EC_POINT *)pt,POINT_CONVERSION_UNCOMPRESSED,
                                 (uchar *)0x0,0,(BN_CTX *)0x0);
    ByteString::resize(&raw,newSize);
    buf = ByteString::operator[](&raw,0);
    EC_POINT_point2oct((EC_GROUP *)grp,(EC_POINT *)pt,POINT_CONVERSION_UNCOMPRESSED,buf,newSize,
                       (BN_CTX *)0x0);
    DERUTIL::raw2Octet(__return_storage_ptr__,&raw);
  }
  ByteString::~ByteString(&raw);
  return __return_storage_ptr__;
}

Assistant:

ByteString OSSL::pt2ByteString(const EC_POINT* pt, const EC_GROUP* grp)
{
	ByteString raw;

	if (pt == NULL || grp == NULL)
		return raw;

	size_t len = EC_POINT_point2oct(grp, pt, POINT_CONVERSION_UNCOMPRESSED, NULL, 0, NULL);
	raw.resize(len);
	EC_POINT_point2oct(grp, pt, POINT_CONVERSION_UNCOMPRESSED, &raw[0], len, NULL);

	return DERUTIL::raw2Octet(raw);
}